

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiStorage::BuildSortByKey(ImGuiStorage *this)

{
  size_t __nmemb;
  
  __nmemb = (size_t)(this->Data).Size;
  if (1 < (long)__nmemb) {
    qsort((this->Data).Data,__nmemb,0x10,BuildSortByKey::StaticFunc::PairCompareByID);
    return;
  }
  return;
}

Assistant:

void ImGuiStorage::BuildSortByKey()
{
    struct StaticFunc 
    { 
        static int IMGUI_CDECL PairCompareByID(const void* lhs, const void* rhs) 
        {
            // We can't just do a subtraction because qsort uses signed integers and subtracting our ID doesn't play well with that.
            if (((const Pair*)lhs)->key > ((const Pair*)rhs)->key) return +1;
            if (((const Pair*)lhs)->key < ((const Pair*)rhs)->key) return -1;
            return 0;
        }
    };
    if (Data.Size > 1)
        qsort(Data.Data, (size_t)Data.Size, sizeof(Pair), StaticFunc::PairCompareByID);
}